

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

parser_error parse_renderer_colors(parser *p)

{
  void *pvVar1;
  char *__s;
  size_t sVar2;
  void *pvVar3;
  undefined4 local_34;
  size_t n;
  char *colors;
  renderer_info *renderer;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getstr(p,"colors");
    mem_free(*(void **)((long)pvVar1 + 0x10));
    sVar2 = strlen(__s);
    if (sVar2 < 0x40) {
      local_34 = (undefined4)sVar2;
    }
    else {
      local_34 = 0x40;
    }
    *(undefined4 *)((long)pvVar1 + 0x40) = local_34;
    pvVar3 = mem_alloc((long)*(int *)((long)pvVar1 + 0x40) << 2);
    *(void **)((long)pvVar1 + 0x10) = pvVar3;
    convert_chars_to_attrs(__s,*(wchar_t *)((long)pvVar1 + 0x40),*(int **)((long)pvVar1 + 0x10));
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_renderer_colors(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *colors;
	size_t n;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	colors = parser_getstr(p, "colors");
	mem_free(renderer->colors);
	n = strlen(colors);
	renderer->ncolors = (n < MAX_PALETTE) ? (int) n : MAX_PALETTE;
	renderer->colors = mem_alloc(renderer->ncolors *
		sizeof(*renderer->colors));
	convert_chars_to_attrs(colors, renderer->ncolors, renderer->colors);
	return PARSE_ERROR_NONE;
}